

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::DumpToString(TemplateDictionary *this,string *out,int indent)

{
  DictionaryPrinter printer;
  DictionaryPrinter local_18;
  
  local_18.writer_.line_state_ = AT_BEGINNING;
  local_18.writer_.out_ = out;
  local_18.writer_.current_indentation_ = indent;
  local_18.writer_.original_indentation_ = indent;
  DictionaryPrinter::DumpToString(&local_18,this);
  if (local_18.writer_.original_indentation_ == local_18.writer_.current_indentation_) {
    return;
  }
  __assert_fail("original_indentation_ == current_indentation_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                ,0x35,"ctemplate::IndentedWriter::~IndentedWriter()");
}

Assistant:

void TemplateDictionary::DumpToString(string* out, int indent) const {
  DictionaryPrinter printer(out, indent);
  printer.DumpToString(*this);
}